

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O2

void __thiscall
Connection_testWeight_Test::~Connection_testWeight_Test(Connection_testWeight_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Connection, testWeight)
{
    EXPECT_EQ(9, int(Connection(0, 10).weight()));
    EXPECT_EQ(39, int(Connection(0, 50).weight()));
    EXPECT_EQ(-39, int(Connection(0, -50).weight()));
    EXPECT_EQ(63, int(Connection(0, 100).weight()));
    EXPECT_EQ(-63, int(Connection(0, -100).weight()));
    EXPECT_EQ(100, int(Connection(0, 10000).weight()));
    EXPECT_EQ(99, int(Connection(0, 100, 100, 10).weight()));
    EXPECT_EQ(86, int(Connection(0, 100, 100, 50).weight()));
    EXPECT_EQ(81, int(Connection(0, 100, 100, 60).weight()));
    EXPECT_EQ(67, int(Connection(0, 100, 100, 90).weight()));
}